

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O3

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::TypeName_abi_cxx11_
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x656e694c;
  *(undefined2 *)((long)&in_RDI->field_2 + 4) = 0x7261;
  in_RDI->_M_string_length = 6;
  (in_RDI->field_2)._M_local_buf[6] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }